

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

ON_SubDVertex * __thiscall
ON_SubD_FixedSizeHeap::FindOrAllocateVertex(ON_SubD_FixedSizeHeap *this,ON_SubDFace *face0)

{
  ushort uVar1;
  bool bVar2;
  uint hash;
  uint uVar3;
  ON_SubDComponentPtr component0;
  ON_SubDVertex *pOVar4;
  double subdP [3];
  double adStack_48 [3];
  
  if ((face0 != (ON_SubDFace *)0x0) && (uVar1 = face0->m_edge_count, 2 < uVar1)) {
    component0 = ON_SubDComponentPtr::Create(face0);
    hash = Internal_Hash(this,component0);
    pOVar4 = Internal_HashFindVertex1(this,hash,component0);
    if (pOVar4 != (ON_SubDVertex *)0x0) {
      if (face0->m_edge_count <= pOVar4->m_edge_capacity) {
        return pOVar4;
      }
      ON_SubDIncrementErrorCount();
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_heap.cpp"
                 ,0x243,"","edge capacity was too small when vertex was created.");
      return pOVar4;
    }
    bVar2 = ON_SubDFace::GetSubdivisionPoint(face0,adStack_48);
    if ((bVar2) &&
       (pOVar4 = AllocateVertex(this,adStack_48,(uint)uVar1), pOVar4 != (ON_SubDVertex *)0x0)) {
      uVar3 = ON_SubDComponentBase::SubdivisionLevel(&face0->super_ON_SubDComponentBase);
      ON_SubDComponentBase::SetSubdivisionLevel(&pOVar4->super_ON_SubDComponentBase,uVar3 + 1);
      pOVar4->m_vertex_tag = Smooth;
      Internal_HashAddPair(this,hash,component0,pOVar4);
      return pOVar4;
    }
  }
  ON_SubDIncrementErrorCount();
  return (ON_SubDVertex *)0x0;
}

Assistant:

ON_SubDVertex * ON_SubD_FixedSizeHeap::FindOrAllocateVertex(const ON_SubDFace * face0)
{
  const unsigned int face0_edge_count = (nullptr != face0) ? ((unsigned int)face0->m_edge_count) : 0U;
  if (face0_edge_count < 3)
    return ON_SUBD_RETURN_ERROR(nullptr);

  const ON_SubDComponentPtr component0 = ON_SubDComponentPtr::Create(face0);
  const unsigned int hash = Internal_Hash(component0);
  ON_SubDVertex* v1 = Internal_HashFindVertex1(hash, component0);

  if (nullptr != v1)
  {
    // found the previously allocated vertex
    if (((unsigned int)v1->m_edge_capacity) < face0->m_edge_count)
    {
      ON_SUBD_ERROR("edge capacity was too small when vertex was created.");
    }
    return v1;
  }

  double subdP[3];
  if (false == face0->GetSubdivisionPoint(subdP))
    return ON_SUBD_RETURN_ERROR(nullptr);

  v1 = AllocateVertex(subdP, face0_edge_count );
  if (nullptr == v1)
    return ON_SUBD_RETURN_ERROR(nullptr);

  v1->SetSubdivisionLevel( face0->SubdivisionLevel() + 1 );
  v1->m_vertex_tag = ON_SubDVertexTag::Smooth;

  Internal_HashAddPair(hash, component0, v1);

  return v1;
}